

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Disk::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Disk *this,Ray *r,Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  Point3fi oi;
  Vector3fi di;
  Point3fi local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Interval local_58;
  undefined1 local_48 [16];
  undefined1 local_30 [16];
  Interval local_20;
  undefined1 extraout_var [60];
  
  local_78._0_4_ = tMax;
  fVar13 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar5._4_4_ = fVar13;
  auVar5._0_4_ = fVar13;
  auVar5._8_4_ = fVar13;
  auVar5._12_4_ = fVar13;
  fVar13 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._4_4_ = fVar13;
  auVar8._0_4_ = fVar13;
  auVar8._8_4_ = fVar13;
  auVar8._12_4_ = fVar13;
  local_68 = vmovlhps_avx(auVar5,auVar8);
  fVar13 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._4_4_ = fVar13;
  auVar9._0_4_ = fVar13;
  auVar9._8_4_ = fVar13;
  auVar9._12_4_ = fVar13;
  local_58 = (Interval)vmovlps_avx(auVar9);
  Transform::operator()(&local_98,this->objectFromRender,(Point3fi *)local_68);
  fVar13 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6._4_4_ = fVar13;
  auVar6._0_4_ = fVar13;
  auVar6._8_4_ = fVar13;
  auVar6._12_4_ = fVar13;
  fVar13 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar10._4_4_ = fVar13;
  auVar10._0_4_ = fVar13;
  auVar10._8_4_ = fVar13;
  auVar10._12_4_ = fVar13;
  local_30 = vmovlhps_avx(auVar6,auVar10);
  fVar13 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._4_4_ = fVar13;
  auVar11._0_4_ = fVar13;
  auVar11._8_4_ = fVar13;
  auVar11._12_4_ = fVar13;
  local_20 = (Interval)vmovlps_avx(auVar11);
  Transform::operator()((Vector3fi *)local_68,this->objectFromRender,(Vector3fi *)local_30);
  fVar13 = (local_58.low + local_58.high) * 0.5;
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    fVar13 = ((local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               low + local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5 + this->height) /
             fVar13;
    if ((0.0 < fVar13) && (fVar13 < (float)local_78._0_4_)) {
      auVar4._4_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar4._8_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar4._0_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar4._12_4_ =
           local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar5 = vinsertps_avx(auVar4,ZEXT416((uint)local_98.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                             ,0x10);
      auVar6 = vinsertps_avx(local_68,ZEXT416((uint)local_68._12_4_),0x10);
      local_48._0_4_ =
           (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar5._0_4_) * 0.5 + fVar13 * (local_68._4_4_ + auVar6._0_4_) * 0.5;
      local_48._4_4_ =
           (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
           auVar5._4_4_) * 0.5 + fVar13 * (local_68._8_4_ + auVar6._4_4_) * 0.5;
      local_48._8_4_ = (auVar5._8_4_ + 0.0) * 0.5 + fVar13 * (auVar6._8_4_ + 0.0) * 0.5;
      local_48._12_4_ = (auVar5._12_4_ + 0.0) * 0.5 + fVar13 * (auVar6._12_4_ + 0.0) * 0.5;
      auVar12._0_4_ = local_48._0_4_ * local_48._0_4_;
      auVar12._4_4_ = local_48._4_4_ * local_48._4_4_;
      auVar12._8_4_ = local_48._8_4_ * local_48._8_4_;
      auVar12._12_4_ = local_48._12_4_ * local_48._12_4_;
      auVar5 = vhaddps_avx(auVar12,auVar12);
      if ((auVar5._0_4_ <= this->radius * this->radius) &&
         (this->innerRadius * this->innerRadius <= auVar5._0_4_)) {
        fVar1 = local_58.low + local_58.high;
        auVar5 = vmovshdup_avx(local_48);
        local_78 = ZEXT416((uint)fVar13);
        auVar7._0_4_ = atan2f(auVar5._0_4_,local_48._0_4_);
        auVar7._4_60_ = extraout_var;
        uVar2 = vcmpss_avx512f(auVar7._0_16_,ZEXT816(0) << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar13 = (float)((uint)bVar3 * (int)(auVar7._0_4_ + 6.2831855) +
                        (uint)!bVar3 * (int)auVar7._0_4_);
        if (fVar13 <= this->phiMax) {
          __return_storage_ptr__->set = true;
          *(undefined4 *)&__return_storage_ptr__->optionalValue = local_78._0_4_;
          uVar2 = vmovlps_avx(local_48);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
               (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + local_98.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
               (float)local_78._0_4_ * fVar1 * 0.5;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar13;
          return __return_storage_ptr__;
        }
      }
    }
  }
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Compute plane intersection for disk
        // Reject disk intersections for rays parallel to the disk's plane
        if (Float(di.z) == 0)
            return {};

        Float tShapeHit = (height - Float(oi.z)) / Float(di.z);
        if (tShapeHit <= 0 || tShapeHit >= tMax)
            return {};

        // See if hit point is inside disk radii and $\phimax$
        Point3f pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        Float dist2 = Sqr(pHit.x) + Sqr(pHit.y);
        if (dist2 > Sqr(radius) || dist2 < Sqr(innerRadius))
            return {};
        // Test disk $\phi$ value against $\phimax$
        Float phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;
        if (phi > phiMax)
            return {};

        // Return _QuadricIntersection_ for disk intersection
        return QuadricIntersection{tShapeHit, pHit, phi};
    }